

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::Members::Members(Members *this)

{
  allocator<char> local_11;
  Members *local_10;
  Members *this_local;
  
  local_10 = this;
  QPDFLogger::defaultLogger();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->message_prefix,"qpdf",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->warnings = false;
  this->encryption_status = 0;
  this->verbose = false;
  std::shared_ptr<char>::shared_ptr(&this->password);
  this->linearize = false;
  this->decrypt = false;
  this->remove_restrictions = false;
  this->split_pages = 0;
  this->progress = false;
  std::function<void_(int)>::function(&this->progress_handler,(nullptr_t)0x0);
  this->suppress_warnings = false;
  this->warnings_exit_zero = false;
  this->copy_encryption = false;
  std::__cxx11::string::string((string *)&this->encryption_file);
  std::shared_ptr<char>::shared_ptr(&this->encryption_file_password);
  this->encrypt = false;
  this->password_is_hex_key = false;
  this->suppress_password_recovery = false;
  this->password_mode = pm_auto;
  this->allow_insecure = false;
  this->allow_weak_crypto = false;
  std::__cxx11::string::string((string *)&this->user_password);
  std::__cxx11::string::string((string *)&this->owner_password);
  this->keylen = 0;
  this->r2_print = true;
  this->r2_modify = true;
  this->r2_extract = true;
  this->r2_annotate = true;
  this->r3_accessibility = true;
  this->r3_extract = true;
  this->r3_assemble = true;
  this->r3_annotate_and_form = true;
  this->r3_form_filling = true;
  this->r3_modify_other = true;
  this->r3_print = qpdf_r3p_full;
  this->force_V4 = false;
  this->force_R5 = false;
  this->cleartext_metadata = false;
  this->use_aes = false;
  this->stream_data_set = false;
  this->stream_data_mode = qpdf_s_compress;
  this->compress_streams = true;
  this->compress_streams_set = false;
  this->recompress_flate = false;
  this->recompress_flate_set = false;
  this->compression_level = -1;
  this->jpeg_quality = -1;
  this->decode_level = qpdf_dl_generalized;
  this->decode_level_set = false;
  this->normalize_set = false;
  this->normalize = false;
  this->suppress_recovery = false;
  this->object_stream_set = false;
  this->object_stream_mode = qpdf_o_preserve;
  this->ignore_xref_streams = false;
  this->qdf_mode = false;
  this->preserve_unreferenced_objects = false;
  this->remove_unreferenced_page_resources = re_auto;
  this->keep_files_open = true;
  this->keep_files_open_set = false;
  this->keep_files_open_threshold = 200;
  this->newline_before_endstream = false;
  std::__cxx11::string::string((string *)&this->linearize_pass1);
  this->coalesce_contents = false;
  this->flatten_annotations = false;
  this->flatten_annotations_required = 0;
  this->flatten_annotations_forbidden = 3;
  this->generate_appearances = false;
  PDFVersion::PDFVersion(&this->max_input_version);
  std::__cxx11::string::string((string *)&this->min_version);
  std::__cxx11::string::string((string *)&this->force_version);
  this->show_npages = false;
  this->deterministic_id = false;
  this->static_id = false;
  this->static_aes_iv = false;
  this->suppress_original_object_id = false;
  this->show_encryption = false;
  this->show_encryption_key = false;
  this->check_linearization = false;
  this->show_linearization = false;
  this->show_xref = false;
  this->show_trailer = false;
  this->show_obj = 0;
  this->show_gen = 0;
  this->show_raw_stream_data = false;
  this->show_filtered_stream_data = false;
  this->show_pages = false;
  this->show_page_images = false;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->collate);
  this->flatten_rotation = false;
  this->list_attachments = false;
  std::__cxx11::string::string((string *)&this->attachment_to_show);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->attachments_to_remove);
  std::__cxx11::list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::list
            (&this->attachments_to_add);
  std::__cxx11::list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>::
  list(&this->attachments_to_copy);
  this->json_version = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->json_keys);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->json_objects);
  this->json_stream_data = qpdf_sj_none;
  this->json_stream_data_set = false;
  std::__cxx11::string::string((string *)&this->json_stream_prefix);
  this->test_json_schema = false;
  this->check = false;
  this->optimize_images = false;
  this->externalize_inline_images = false;
  this->keep_inline_images = false;
  this->remove_info = false;
  this->remove_metadata = false;
  this->remove_page_labels = false;
  this->remove_structure = false;
  this->oi_min_width = 0x80;
  this->oi_min_height = 0x80;
  this->oi_min_area = 0x4000;
  this->ii_min_bytes = 0x400;
  std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::vector
            (&this->underlay);
  std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::vector(&this->overlay)
  ;
  this->under_overlay = (UnderOverlay *)0x0;
  std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::vector(&this->page_specs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
  ::map(&this->rotations);
  this->require_outfile = true;
  this->replace_input = false;
  this->check_is_encrypted = false;
  this->check_requires_password = false;
  std::shared_ptr<char>::shared_ptr(&this->infilename);
  std::shared_ptr<char>::shared_ptr(&this->outfilename);
  this->json_input = false;
  this->json_output = false;
  std::__cxx11::string::string((string *)&this->update_from_json);
  this->report_mem_usage = false;
  std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>::vector
            (&this->page_label_specs);
  return;
}

Assistant:

QPDFJob::Members::Members() :
    log(QPDFLogger::defaultLogger())
{
}